

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn_logistic<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  int i;
  size_t i_00;
  float local_3c;
  
  fVar1 = ec->weight;
  local_3c = 0.0;
  if ((float)o->t < 0.0) {
    sqrtf((float)o->t);
  }
  for (i_00 = 0; (long)i_00 < (long)o->N; i_00 = i_00 + 1) {
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    local_3c = local_3c +
               (ec->pred).scalar *
               (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[i_00];
  }
  ec->weight = fVar1;
  ec->partial_prediction = local_3c;
  fVar2 = *(float *)(&DAT_002345c8 + (ulong)(0.0 < local_3c) * 4);
  (ec->pred).scalar = fVar2;
  ec->loss = (float)(~-(uint)(fVar2 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}